

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoop.cpp
# Opt level: O3

void __thiscall
sznet::net::KcpTcpEventLoop::KcpTcpEventLoop
          (KcpTcpEventLoop *this,InetAddress udpLisetenAddr,string *name,int seed,int kcpMode)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  uint *puVar3;
  pointer pcVar4;
  sz_sock fd;
  Timestamp TVar5;
  long lVar6;
  _func_int **pp_Var7;
  undefined1 auVar8 [32];
  _Any_data local_68;
  code *local_58;
  code *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  Socket *local_40;
  Channel *local_38;
  
  EventLoop::EventLoop(&this->super_EventLoop);
  (this->super_EventLoop)._vptr_EventLoop = (_func_int **)&PTR__KcpTcpEventLoop_0014f530;
  *(long *)&(this->m_udpLisetenAddr).field_0 = udpLisetenAddr.field_0._0_8_;
  *(long *)((long)&(this->m_udpLisetenAddr).field_0 + 8) = udpLisetenAddr.field_0._8_8_;
  *(long *)((long)&(this->m_udpLisetenAddr).field_0 + 0xc) = udpLisetenAddr.field_0._12_8_;
  *(undefined8 *)((long)&(this->m_udpLisetenAddr).field_0 + 0x14) = udpLisetenAddr.field_0._20_8_;
  fd = sockets::sz_udp_createnonblockingordie((uint)udpLisetenAddr.field_0.m_addr.sin_family);
  local_40 = &this->m_udpSocket;
  (this->m_udpSocket).m_sockfd = fd;
  (this->m_udpSocket).m_ableClose = true;
  local_38 = &this->m_udpChannel;
  Channel::Channel(local_38,&this->super_EventLoop,fd);
  Buffer::Buffer(&this->m_inputBuffer,4,0x400);
  Buffer::Buffer(&this->m_tmpBuffer,4,0x400);
  p_Var1 = &(this->m_tcpConnections)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = &(this->m_kcpConnections)._M_t._M_impl.super__Rb_tree_header;
  (this->m_tcpConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_tcpConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_tcpConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_tcpConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_tcpConnections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_kcpConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_kcpConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_kcpConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header
  ;
  (this->m_kcpConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->m_kcpConnections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_addrConns)._M_h._M_buckets = &(this->m_addrConns)._M_h._M_single_bucket;
  (this->m_addrConns)._M_h._M_bucket_count = 1;
  (this->m_addrConns)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->m_addrConns)._M_h._M_element_count = 0;
  (this->m_addrConns)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  auVar8 = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])&(this->m_addrConns)._M_h._M_rehash_policy._M_next_resize = auVar8;
  (this->m_netStatInfo).m_recvBytes = SUB168(auVar8._0_16_,0);
  (this->m_netStatInfo).m_sendBytes = SUB168(auVar8._0_16_,8);
  (this->m_prevNetStatInfo).m_recvBytes = SUB168(auVar8._16_16_,0);
  (this->m_prevNetStatInfo).m_sendBytes = SUB168(auVar8._16_16_,8);
  TVar5 = Timestamp::now();
  (this->m_calcNetLastTime).m_microSecondsSinceEpoch = TVar5.m_microSecondsSinceEpoch;
  lVar6 = 0x59;
  pp_Var7 = (_func_int **)(ulong)(uint)seed;
  (this->m_random)._M_x[0] = (unsigned_long)pp_Var7;
  do {
    pp_Var7 = (_func_int **)
              (ulong)((int)lVar6 + -0x58 +
                     ((uint)((ulong)pp_Var7 >> 0x1e) ^ (uint)pp_Var7) * 0x6c078965);
    (&(this->super_EventLoop)._vptr_EventLoop)[lVar6] = pp_Var7;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x2c8);
  p_Var1 = &(this->m_crypts)._M_t._M_impl.super__Rb_tree_header;
  (this->m_random)._M_p = 0x270;
  (this->m_crypts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_crypts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_crypts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_crypts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_crypts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_curConv = 0;
  local_48 = &(this->m_name).field_2;
  (this->m_curTcpConn).super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_curTcpConn).super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_curKcpConn).super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_curKcpConn).super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_name)._M_dataplus._M_p = (pointer)local_48;
  pcVar4 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar4,pcVar4 + name->_M_string_length);
  *(undefined8 *)&(this->m_kcpMessageCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_kcpMessageCallback).super__Function_base._M_functor + 8) = 0;
  (this->m_kcpMessageCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_kcpMessageCallback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_kcpWriteCompleteCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_kcpWriteCompleteCallback).super__Function_base._M_functor + 8) = 0
  ;
  (this->m_kcpWriteCompleteCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_kcpWriteCompleteCallback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_kcpConnectionCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_kcpConnectionCallback).super__Function_base._M_functor + 8) = 0;
  (this->m_kcpConnectionCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_kcpConnectionCallback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_kcpMessageCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_kcpMessageCallback).super__Function_base._M_functor + 8) = 0;
  (this->m_kcpMessageCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_kcpMessageCallback)._M_invoker = (_Invoker_type)0x0;
  this->m_kcpMode = kcpMode;
  Socket::bindAddress(local_40,&this->m_udpLisetenAddr);
  puVar3 = &(this->m_udpChannel).m_events;
  *(byte *)puVar3 = (byte)*puVar3 | 1;
  Channel::update(local_38);
  local_68._8_8_ = 0;
  local_68._M_unused._M_object = operator_new(0x18);
  *(code **)local_68._M_unused._0_8_ = handleUdpRead;
  *(undefined8 *)((long)local_68._M_unused._0_8_ + 8) = 0;
  *(KcpTcpEventLoop **)((long)local_68._M_unused._0_8_ + 0x10) = this;
  local_50 = std::
             _Function_handler<void_(sznet::Timestamp),_std::_Bind<void_(sznet::net::KcpTcpEventLoop::*(sznet::net::KcpTcpEventLoop_*,_std::_Placeholder<1>))(sznet::Timestamp)>_>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(sznet::Timestamp),_std::_Bind<void_(sznet::net::KcpTcpEventLoop::*(sznet::net::KcpTcpEventLoop_*,_std::_Placeholder<1>))(sznet::Timestamp)>_>
             ::_M_manager;
  std::function<void_(sznet::Timestamp)>::operator=
            (&(this->m_udpChannel).m_readCallback,(function<void_(sznet::Timestamp)> *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  return;
}

Assistant:

KcpTcpEventLoop::KcpTcpEventLoop(const InetAddress udpLisetenAddr, string name, int seed, int kcpMode) :
	EventLoop(),
	m_udpLisetenAddr(udpLisetenAddr),
	m_udpSocket(sockets::sz_udp_createnonblockingordie(udpLisetenAddr.family())),
	m_udpChannel(this, m_udpSocket.fd()),
	m_calcNetLastTime(Timestamp::now()),
	m_random(seed),
	m_curConv(0),
	m_name(name),
	m_kcpMode(kcpMode)
{
	m_udpSocket.bindAddress(m_udpLisetenAddr);
	m_udpChannel.enableReading();
	m_udpChannel.setReadCallback(std::bind(&KcpTcpEventLoop::handleUdpRead, this, std::placeholders::_1));
}